

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_simple_mcc_decorrelation_data_t *poVar2;
  char *fmt;
  opj_mct_data_t *poVar3;
  OPJ_BOOL OVar4;
  uint uVar5;
  uint uVar6;
  opj_simple_mcc_decorrelation_data_t *poVar7;
  opj_tcp_t *poVar8;
  long lVar9;
  OPJ_BYTE *pOVar10;
  OPJ_UINT32 OVar11;
  OPJ_UINT32 OVar12;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 l_nb_comps;
  OPJ_UINT32 l_indix;
  OPJ_UINT32 l_nb_collections;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  OPJ_UINT32 local_48;
  uint local_44;
  opj_tcp_t *local_40;
  opj_mct_data_t **local_38;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1522,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1523,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1524,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar8 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar8 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size < 2) {
LAB_00113431:
    OVar4 = 0;
    opj_event_msg(p_manager,1,"Error reading MCC marker\n");
  }
  else {
    opj_read_bytes_LE(p_header_data,&local_5c,2);
    if (local_5c == 0) {
      if (p_header_size < 7) goto LAB_00113431;
      opj_read_bytes_LE(p_header_data + 2,&local_54,1);
      poVar2 = poVar8->m_mcc_records;
      local_48 = poVar8->m_nb_mcc_records;
      OVar11 = 0;
      poVar7 = poVar2;
      OVar12 = 0;
      if (local_48 != 0) {
        do {
          OVar12 = OVar11;
          if (poVar7->m_index == local_54) break;
          poVar7 = poVar7 + 1;
          OVar11 = OVar11 + 1;
          OVar12 = local_48;
        } while (local_48 != OVar11);
      }
      local_40 = poVar8;
      if (OVar12 == local_48) {
        if (local_48 == poVar8->m_nb_max_mcc_records) {
          uVar6 = poVar8->m_nb_max_mcc_records + 10;
          poVar8->m_nb_max_mcc_records = uVar6;
          poVar2 = (opj_simple_mcc_decorrelation_data_t *)opj_realloc(poVar2,(ulong)uVar6 << 5);
          if (poVar2 == (opj_simple_mcc_decorrelation_data_t *)0x0) {
            opj_free(poVar8->m_mcc_records);
            poVar8->m_mcc_records = (opj_simple_mcc_decorrelation_data_t *)0x0;
            poVar8->m_nb_mcc_records = 0;
            poVar8->m_nb_max_mcc_records = 0;
            opj_event_msg(p_manager,1,"Not enough memory to read MCC marker\n");
            return 0;
          }
          poVar8->m_mcc_records = poVar2;
          memset(poVar2 + poVar8->m_nb_mcc_records,0,
                 (ulong)(poVar8->m_nb_max_mcc_records - poVar8->m_nb_mcc_records) << 5);
        }
        poVar7 = local_40->m_mcc_records + local_40->m_nb_mcc_records;
      }
      poVar7->m_index = local_54;
      opj_read_bytes_LE(p_header_data + 3,&local_5c,2);
      if (local_5c != 0) goto LAB_00113466;
      opj_read_bytes_LE(p_header_data + 5,&local_44,2);
      if (local_44 < 2) {
        uVar6 = p_header_size - 7;
        if (local_44 != 0) {
          pOVar10 = p_header_data + 7;
          local_38 = &poVar7->m_decorrelation_array;
          uVar1 = 0;
          do {
            if (uVar6 < 3) goto LAB_00113431;
            local_4c = uVar1;
            opj_read_bytes_LE(pOVar10,&local_5c,1);
            if (local_5c != 1) {
              fmt = "Cannot take in charge collections other than array decorrelation\n";
              goto LAB_0011346d;
            }
            opj_read_bytes_LE(pOVar10 + 1,&local_58,2);
            lVar9 = (ulong)(local_58 >> 0xf) + 1;
            poVar7->m_nb_comps = local_58 & 0x7fff;
            OVar11 = (OPJ_UINT32)lVar9;
            uVar1 = (local_58 & 0x7fff) * OVar11 + 2;
            uVar5 = (uVar6 - 3) - uVar1;
            if (uVar6 - 3 < uVar1) goto LAB_00113431;
            pOVar10 = pOVar10 + 3;
            local_50 = uVar5;
            if (poVar7->m_nb_comps != 0) {
              uVar6 = 0;
              do {
                opj_read_bytes_LE(pOVar10,&local_5c,OVar11);
                if (uVar6 != local_5c) goto LAB_0011380b;
                pOVar10 = pOVar10 + lVar9;
                uVar6 = uVar6 + 1;
              } while (uVar6 < poVar7->m_nb_comps);
            }
            opj_read_bytes_LE(pOVar10,&local_58,2);
            uVar6 = local_58 & 0x7fff;
            if (uVar6 != poVar7->m_nb_comps) {
              fmt = "Cannot take in charge collections without same number of indixes\n";
              local_58 = uVar6;
              goto LAB_0011346d;
            }
            lVar9 = (ulong)(local_58 >> 0xf) + 1;
            OVar11 = (OPJ_UINT32)lVar9;
            uVar1 = poVar7->m_nb_comps * OVar11 + 3;
            uVar5 = local_50 - uVar1;
            local_58 = uVar6;
            if (local_50 < uVar1) goto LAB_00113431;
            pOVar10 = pOVar10 + 2;
            local_50 = uVar5;
            if (poVar7->m_nb_comps != 0) {
              uVar1 = 0;
              do {
                opj_read_bytes_LE(pOVar10,&local_5c,OVar11);
                if (uVar1 != local_5c) goto LAB_0011380b;
                pOVar10 = pOVar10 + lVar9;
                uVar1 = uVar1 + 1;
              } while (uVar1 < poVar7->m_nb_comps);
            }
            opj_read_bytes_LE(pOVar10,&local_5c,3);
            poVar7->field_0x18 = poVar7->field_0x18 & 0xfe | (local_5c >> 0x10 & 1) == 0;
            *local_38 = (opj_mct_data_t *)0x0;
            local_38[1] = (opj_mct_data_t *)0x0;
            local_54 = local_5c & 0xff;
            if (local_54 != 0) {
              OVar11 = local_40->m_nb_mct_records;
              if (OVar11 != 0) {
                poVar3 = local_40->m_mct_records;
                do {
                  if (poVar3->m_index == local_54) {
                    *local_38 = poVar3;
                    break;
                  }
                  poVar3 = poVar3 + 1;
                  OVar11 = OVar11 - 1;
                } while (OVar11 != 0);
              }
              if (*local_38 == (opj_mct_data_t *)0x0) goto LAB_00113431;
            }
            local_54 = local_5c >> 8 & 0xff;
            if (local_54 != 0) {
              OVar11 = local_40->m_nb_mct_records;
              if (OVar11 != 0) {
                poVar3 = local_40->m_mct_records;
                do {
                  if (poVar3->m_index == local_54) {
                    poVar7->m_offset_array = poVar3;
                    break;
                  }
                  poVar3 = poVar3 + 1;
                  OVar11 = OVar11 - 1;
                } while (OVar11 != 0);
              }
              if (poVar7->m_offset_array == (opj_mct_data_t *)0x0) goto LAB_00113431;
            }
            pOVar10 = pOVar10 + 3;
            uVar1 = local_4c + 1;
            uVar6 = local_50;
          } while (uVar1 < local_44);
        }
        if (uVar6 == 0) {
          if (OVar12 != local_48) {
            return 1;
          }
          local_40->m_nb_mcc_records = local_40->m_nb_mcc_records + 1;
          return 1;
        }
        goto LAB_00113431;
      }
      fmt = "Cannot take in charge multiple collections\n";
    }
    else {
LAB_00113466:
      fmt = "Cannot take in charge multiple data spanning\n";
    }
LAB_0011346d:
    opj_event_msg(p_manager,2,fmt);
    OVar4 = 1;
  }
  return OVar4;
LAB_0011380b:
  fmt = "Cannot take in charge collections with indix shuffle\n";
  goto LAB_0011346d;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mcc (     opj_j2k_t *p_j2k,
                                                OPJ_BYTE * p_header_data,
                                                OPJ_UINT32 p_header_size,
                                                opj_event_mgr_t * p_manager )
{
        OPJ_UINT32 i,j;
        OPJ_UINT32 l_tmp;
        OPJ_UINT32 l_indix;
        opj_tcp_t * l_tcp;
        opj_simple_mcc_decorrelation_data_t * l_mcc_record;
        opj_mct_data_t * l_mct_data;
        OPJ_UINT32 l_nb_collections;
        OPJ_UINT32 l_nb_comps;
        OPJ_UINT32 l_nb_bytes_by_comp;
        OPJ_BOOL l_new_mcc = OPJ_FALSE;

        /* preconditions */
        assert(p_header_data != 00);
        assert(p_j2k != 00);
        assert(p_manager != 00);

        l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
                        &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
                        p_j2k->m_specific_param.m_decoder.m_default_tcp;

        if (p_header_size < 2) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
        }

        /* first marker */
        opj_read_bytes(p_header_data,&l_tmp,2);                         /* Zmcc */
        p_header_data += 2;
        if (l_tmp != 0) {
                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge multiple data spanning\n");
                return OPJ_TRUE;
        }

        if (p_header_size < 7) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
        }

        opj_read_bytes(p_header_data,&l_indix,1); /* Imcc -> no need for other values, take the first */
        ++p_header_data;

        l_mcc_record = l_tcp->m_mcc_records;

        for(i=0;i<l_tcp->m_nb_mcc_records;++i) {
                if (l_mcc_record->m_index == l_indix) {
                        break;
                }
                ++l_mcc_record;
        }

        /** NOT FOUND */
        if (i == l_tcp->m_nb_mcc_records) {
                if (l_tcp->m_nb_mcc_records == l_tcp->m_nb_max_mcc_records) {
                        opj_simple_mcc_decorrelation_data_t *new_mcc_records;
                        l_tcp->m_nb_max_mcc_records += OPJ_J2K_MCC_DEFAULT_NB_RECORDS;

                        new_mcc_records = (opj_simple_mcc_decorrelation_data_t *) opj_realloc(
                                        l_tcp->m_mcc_records, l_tcp->m_nb_max_mcc_records * sizeof(opj_simple_mcc_decorrelation_data_t));
                        if (! new_mcc_records) {
                                opj_free(l_tcp->m_mcc_records);
                                l_tcp->m_mcc_records = NULL;
                                l_tcp->m_nb_max_mcc_records = 0;
                                l_tcp->m_nb_mcc_records = 0;
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read MCC marker\n");
                                return OPJ_FALSE;
                        }
                        l_tcp->m_mcc_records = new_mcc_records;
                        l_mcc_record = l_tcp->m_mcc_records + l_tcp->m_nb_mcc_records;
                        memset(l_mcc_record,0,(l_tcp->m_nb_max_mcc_records-l_tcp->m_nb_mcc_records) * sizeof(opj_simple_mcc_decorrelation_data_t));
                }
                l_mcc_record = l_tcp->m_mcc_records + l_tcp->m_nb_mcc_records;
                l_new_mcc = OPJ_TRUE;
        }
        l_mcc_record->m_index = l_indix;

        /* only one marker atm */
        opj_read_bytes(p_header_data,&l_tmp,2);                         /* Ymcc */
        p_header_data+=2;
        if (l_tmp != 0) {
                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge multiple data spanning\n");
                return OPJ_TRUE;
        }

        opj_read_bytes(p_header_data,&l_nb_collections,2);                              /* Qmcc -> number of collections -> 1 */
        p_header_data+=2;

        if (l_nb_collections > 1) {
                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge multiple collections\n");
                return OPJ_TRUE;
        }

        p_header_size -= 7;

        for (i=0;i<l_nb_collections;++i) {
                if (p_header_size < 3) {
                        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                        return OPJ_FALSE;
                }

                opj_read_bytes(p_header_data,&l_tmp,1); /* Xmcci type of component transformation -> array based decorrelation */
                ++p_header_data;

                if (l_tmp != 1) {
                        opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge collections other than array decorrelation\n");
                        return OPJ_TRUE;
                }

                opj_read_bytes(p_header_data,&l_nb_comps,2);

                p_header_data+=2;
                p_header_size-=3;

                l_nb_bytes_by_comp = 1 + (l_nb_comps>>15);
                l_mcc_record->m_nb_comps = l_nb_comps & 0x7fff;

                if (p_header_size < (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 2)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                        return OPJ_FALSE;
                }

                p_header_size -= (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 2);

                for (j=0;j<l_mcc_record->m_nb_comps;++j) {
                        opj_read_bytes(p_header_data,&l_tmp,l_nb_bytes_by_comp);        /* Cmccij Component offset*/
                        p_header_data+=l_nb_bytes_by_comp;

                        if (l_tmp != j) {
                                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge collections with indix shuffle\n");
                                return OPJ_TRUE;
                        }
                }

                opj_read_bytes(p_header_data,&l_nb_comps,2);
                p_header_data+=2;

                l_nb_bytes_by_comp = 1 + (l_nb_comps>>15);
                l_nb_comps &= 0x7fff;

                if (l_nb_comps != l_mcc_record->m_nb_comps) {
                        opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge collections without same number of indixes\n");
                        return OPJ_TRUE;
                }

                if (p_header_size < (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 3)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                        return OPJ_FALSE;
                }

                p_header_size -= (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 3);

                for (j=0;j<l_mcc_record->m_nb_comps;++j) {
                        opj_read_bytes(p_header_data,&l_tmp,l_nb_bytes_by_comp);        /* Wmccij Component offset*/
                        p_header_data+=l_nb_bytes_by_comp;

                        if (l_tmp != j) {
                                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge collections with indix shuffle\n");
                                return OPJ_TRUE;
                        }
                }

                opj_read_bytes(p_header_data,&l_tmp,3); /* Wmccij Component offset*/
                p_header_data += 3;

                l_mcc_record->m_is_irreversible = ! ((l_tmp>>16) & 1);
                l_mcc_record->m_decorrelation_array = 00;
                l_mcc_record->m_offset_array = 00;

                l_indix = l_tmp & 0xff;
                if (l_indix != 0) {
                        l_mct_data = l_tcp->m_mct_records;
                        for (j=0;j<l_tcp->m_nb_mct_records;++j) {
                                if (l_mct_data->m_index == l_indix) {
                                        l_mcc_record->m_decorrelation_array = l_mct_data;
                                        break;
                                }
                                ++l_mct_data;
                        }

                        if (l_mcc_record->m_decorrelation_array == 00) {
                                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                                return OPJ_FALSE;
                        }
                }

                l_indix = (l_tmp >> 8) & 0xff;
                if (l_indix != 0) {
                        l_mct_data = l_tcp->m_mct_records;
                        for (j=0;j<l_tcp->m_nb_mct_records;++j) {
                                if (l_mct_data->m_index == l_indix) {
                                        l_mcc_record->m_offset_array = l_mct_data;
                                        break;
                                }
                                ++l_mct_data;
                        }

                        if (l_mcc_record->m_offset_array == 00) {
                                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                                return OPJ_FALSE;
                        }
                }
        }

        if (p_header_size != 0) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
        }

        if (l_new_mcc) {
                ++l_tcp->m_nb_mcc_records;
        }

        return OPJ_TRUE;
}